

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::MakeEchoProgress(cmMakefileTargetGenerator *this,EchoProgress *progress)

{
  string *a;
  ostream *poVar1;
  ostringstream progressArg;
  string local_1b0 [32];
  string local_190 [11];
  
  a = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this->LocalGenerator);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[12]>(local_190,a,(char (*) [12])"/CMakeFiles");
  std::__cxx11::string::operator=((string *)progress,(string *)local_190);
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  poVar1 = std::operator<<((ostream *)local_190,"$(CMAKE_PROGRESS_");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&progress->Arg,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return;
}

Assistant:

void cmMakefileTargetGenerator::MakeEchoProgress(
  cmLocalUnixMakefileGenerator3::EchoProgress& progress) const
{
  progress.Dir =
    cmStrCat(this->LocalGenerator->GetBinaryDirectory(), "/CMakeFiles");
  std::ostringstream progressArg;
  progressArg << "$(CMAKE_PROGRESS_" << this->NumberOfProgressActions << ")";
  progress.Arg = progressArg.str();
}